

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_manager.cpp
# Opt level: O2

void __thiscall
miniros::ServiceManager::start
          (ServiceManager *this,PollManagerPtr *pm,MasterLinkPtr *master_link,
          ConnectionManagerPtr *cm,XMLRPCManagerPtr *rpcm)

{
  this->shutting_down_ = false;
  std::__shared_ptr<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->master_link_).
              super___shared_ptr<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2>,
             &master_link->super___shared_ptr<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<miniros::PollManager,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->poll_manager_).
              super___shared_ptr<miniros::PollManager,_(__gnu_cxx::_Lock_policy)2>,
             &pm->super___shared_ptr<miniros::PollManager,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<miniros::ConnectionManager,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->connection_manager_).
              super___shared_ptr<miniros::ConnectionManager,_(__gnu_cxx::_Lock_policy)2>,
             &cm->super___shared_ptr<miniros::ConnectionManager,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->xmlrpc_manager_).
              super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>,
             &rpcm->super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

void ServiceManager::start(PollManagerPtr pm, MasterLinkPtr master_link, ConnectionManagerPtr cm, XMLRPCManagerPtr rpcm)
{
  shutting_down_ = false;

  master_link_ = master_link;
  poll_manager_ = pm;
  connection_manager_ = cm;
  xmlrpc_manager_ = rpcm;
}